

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItem::setChildIndicatorPolicy(QTreeWidgetItem *this,ChildIndicatorPolicy policy)

{
  if (this->d->policy != policy) {
    this->d->policy = policy;
    if ((QAbstractItemView *)this->view != (QAbstractItemView *)0x0) {
      QAbstractItemView::scheduleDelayedItemsLayout((QAbstractItemView *)this->view);
      return;
    }
  }
  return;
}

Assistant:

void QTreeWidgetItem::setChildIndicatorPolicy(QTreeWidgetItem::ChildIndicatorPolicy policy)
{
    if (d->policy == policy)
        return;
    d->policy = policy;

    if (!view)
        return;

    view->scheduleDelayedItemsLayout();
}